

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O3

void __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::add
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *key
          ,ByteArray<2UL> *value)

{
  undefined2 uVar1;
  KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *pKVar2;
  ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long> *pEVar3;
  int iVar4;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *pKVar5;
  _Head_base<0UL,_unsigned_char_*,_false> _Var6;
  long lVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *local_50;
  unsigned_long local_48;
  undefined8 uStack_40;
  
  pKVar2 = (this->diskDataStorage_)._M_t.
           super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
           ._M_head_impl;
  pKVar5 = (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *)operator_new(0x10);
  uVar1 = *(undefined2 *)(key->super_array<unsigned_char,_2UL>)._M_elems;
  _Var6._M_head_impl = (uchar *)operator_new__(2);
  *(undefined2 *)_Var6._M_head_impl =
       *(undefined2 *)
        (value->data_)._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  *(undefined2 *)(pKVar5->key).super_array<unsigned_char,_2UL>._M_elems = uVar1;
  (pKVar5->value).data_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var6._M_head_impl;
  local_50 = pKVar5;
  (*(code *)*(pKVar2->
             super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
             ).
             super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
             ._vptr_OrderedStorage)(pKVar2);
  if (local_50 != (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *)0x0) {
    std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>::
    operator()((default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_> *
               )&local_50,local_50);
  }
  pEVar3 = (this->innerStorage_)._M_t.
           super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
           ._M_head_impl;
  lVar7 = (**(code **)(*(long *)&(((this->diskDataStorage_)._M_t.
                                   super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
                                  ._M_head_impl)->
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                                 ).
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                      + 8))();
  local_50 = (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *)(lVar7 + -1);
  (**(pEVar3->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
     _vptr_KeyValueStorage)(pEVar3,key);
  iVar4 = (*(((this->innerStorage_)._M_t.
              super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_*,_false>
             ._M_head_impl)->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>
            )._vptr_KeyValueStorage[3])();
  if (this->keyIndexBatchSize_ <= CONCAT44(extraout_var,iVar4)) {
    dropRamIndexToDisk(this);
  }
  pKVar2 = (this->diskDataStorage_)._M_t.
           super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_*,_false>
           ._M_head_impl;
  local_48 = (pKVar2->notSortedStorage_).
             super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
             .
             super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
             .register_.count_;
  uStack_40 = 0;
  uVar8 = (**(code **)(*(long *)&(pKVar2->
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                                 ).
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
                      + 8))();
  auVar9._8_4_ = (int)(local_48 >> 0x20);
  auVar9._0_8_ = local_48;
  auVar9._12_4_ = 0x45300000;
  auVar10._8_4_ = (int)((ulong)uVar8 >> 0x20);
  auVar10._0_8_ = uVar8;
  auVar10._12_4_ = 0x45300000;
  if (this->maxNotSortedPart_ <=
      ((auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) /
      ((auVar10._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0))) {
    dropRamIndexToDisk(this);
    shrinkDataStorage(this);
  }
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        diskDataStorage_->append(std::make_unique<KeyVal>(key, value));
        innerStorage_->add(key, diskDataStorage_->getLastElementIndex());
        if (innerStorage_->getUpperSizeBound() >= keyIndexBatchSize_) {
            dropRamIndexToDisk();
        }

        IndexT notSortedStorageSize = diskDataStorage_->getNotSortedItemsCount();
        IndexT totalStorageSize = diskDataStorage_->getItemsCount();

        double notSortedPart = static_cast<double>(notSortedStorageSize) / static_cast<double>(totalStorageSize);

        if (notSortedPart >= maxNotSortedPart_) {
            dropRamIndexToDisk();
            shrinkDataStorage();
        }
    }